

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O1

void __thiscall ArgParser::initOptions(ArgParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *choices [4];
  string local_2b8;
  string local_298;
  string local_278;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  string local_238;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *pcStack_1a0;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  _Any_data local_158;
  code *local_148;
  undefined8 uStack_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined8 uStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_258._0_8_ = &local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"potato","");
  local_168 = (code *)0x0;
  pcStack_160 = (code *)0x0;
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_178._M_unused._M_object = operator_new(0x18);
  *(code **)local_178._M_unused._0_8_ = handlePotato;
  *(undefined8 *)((long)local_178._M_unused._0_8_ + 8) = 0;
  *(ArgParser **)((long)local_178._M_unused._0_8_ + 0x10) = this;
  pcStack_160 = std::
                _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)()>_(ArgParser_*)>_>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)()>_(ArgParser_*)>_>
              ::_M_manager;
  QPDFArgParser::addBare(&this->ap,(string *)local_258,(bare_arg_handler_t *)&local_178);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._0_8_ != &local_248) {
    operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
  }
  local_258._0_8_ = &local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"salad","");
  local_188 = (code *)0x0;
  pcStack_180 = (code *)0x0;
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_198._M_unused._M_object = operator_new(0x18);
  *(code **)local_198._M_unused._0_8_ = handleSalad;
  *(undefined8 *)((long)local_198._M_unused._0_8_ + 8) = 0;
  *(ArgParser **)((long)local_198._M_unused._0_8_ + 0x10) = this;
  pcStack_180 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(ArgParser_*,_std::_Placeholder<1>)>_>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(ArgParser_*,_std::_Placeholder<1>)>_>
              ::_M_manager;
  QPDFArgParser::addRequiredParameter
            (&this->ap,(string *)local_258,(param_arg_handler_t *)&local_198,"tossed");
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._0_8_ != &local_248) {
    operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
  }
  local_258._0_8_ = &local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"moo","");
  local_1a8 = (code *)0x0;
  pcStack_1a0 = (code *)0x0;
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_1b8._M_unused._0_8_ = handleMoo;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 8) = 0;
  *(ArgParser **)((long)local_1b8._M_unused._0_8_ + 0x10) = this;
  pcStack_1a0 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(ArgParser_*,_std::_Placeholder<1>)>_>
                ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(ArgParser_*,_std::_Placeholder<1>)>_>
              ::_M_manager;
  QPDFArgParser::addOptionalParameter
            (&this->ap,(string *)local_258,(param_arg_handler_t *)&local_1b8);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._0_8_ != &local_248) {
    operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
  }
  local_248._M_allocated_capacity = 0x26304e;
  local_248._8_8_ = 0;
  local_258._0_8_ = "pig";
  local_258._8_4_ = 0x263049;
  local_258._12_4_ = 0;
  paVar1 = &local_2b8.field_2;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"oink","");
  local_1c8 = (code *)0x0;
  pcStack_1c0 = (code *)0x0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_1d8._M_unused._0_8_ = handleOink;
  *(undefined8 *)((long)local_1d8._M_unused._0_8_ + 8) = 0;
  *(ArgParser **)((long)local_1d8._M_unused._0_8_ + 0x10) = this;
  pcStack_1c0 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(ArgParser_*,_std::_Placeholder<1>)>_>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(ArgParser_*,_std::_Placeholder<1>)>_>
              ::_M_manager;
  QPDFArgParser::addChoices
            (&this->ap,&local_2b8,(param_arg_handler_t *)&local_1d8,true,(char **)local_258);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  QPDFArgParser::selectHelpOptionTable(&this->ap);
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"version","");
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:54:27)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:54:27)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_2b8,(bare_arg_handler_t *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  QPDFArgParser::selectMainOptionTable(&this->ap);
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"quack","");
  local_1e8 = (code *)0x0;
  pcStack_1e0 = (code *)0x0;
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_1f8._M_unused._0_8_ = startQuack;
  *(undefined8 *)((long)local_1f8._M_unused._0_8_ + 8) = 0;
  *(ArgParser **)((long)local_1f8._M_unused._0_8_ + 0x10) = this;
  pcStack_1e0 = std::
                _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)()>_(ArgParser_*)>_>
                ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)()>_(ArgParser_*)>_>
              ::_M_manager;
  QPDFArgParser::addBare(&this->ap,&local_2b8,(bare_arg_handler_t *)&local_1f8);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"quack","");
  local_208 = (code *)0x0;
  pcStack_200 = (code *)0x0;
  local_218._M_unused._M_object = (void *)0x0;
  local_218._8_8_ = 0;
  local_218._M_unused._M_object = operator_new(0x18);
  *(code **)local_218._M_unused._0_8_ = endQuack;
  *(undefined8 *)((long)local_218._M_unused._0_8_ + 8) = 0;
  *(ArgParser **)((long)local_218._M_unused._0_8_ + 0x10) = this;
  pcStack_200 = std::
                _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)()>_(ArgParser_*)>_>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)()>_(ArgParser_*)>_>
              ::_M_manager;
  QPDFArgParser::registerOptionTable(&this->ap,&local_2b8,(bare_arg_handler_t *)&local_218);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(code **)local_78._M_unused._0_8_ = getQuack;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(ArgParser **)((long)local_78._M_unused._0_8_ + 0x10) = this;
  pcStack_60 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(ArgParser_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(ArgParser_*,_std::_Placeholder<1>)>_>
             ::_M_manager;
  QPDFArgParser::addPositional(&this->ap,(param_arg_handler_t *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x18);
  *(code **)local_98._M_unused._0_8_ = finalChecks;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
  *(ArgParser **)((long)local_98._M_unused._0_8_ + 0x10) = this;
  pcStack_80 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)()>_(ArgParser_*)>_>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(ArgParser::*)()>_(ArgParser_*)>_>
             ::_M_manager;
  QPDFArgParser::addFinalCheck(&this->ap,(bare_arg_handler_t *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  QPDFArgParser::selectMainOptionTable(&this->ap);
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"baaa","");
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:61:24)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:61:24)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_2b8,(bare_arg_handler_t *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"baaa","");
  local_c8 = (code *)0x0;
  uStack_c0 = 0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  QPDFArgParser::registerOptionTable(&this->ap,&local_2b8,(bare_arg_handler_t *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"ewe","");
  local_f8._8_8_ = 0;
  pcStack_e0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:63:23)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:63:23)>
             ::_M_manager;
  local_f8._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_2b8,(bare_arg_handler_t *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"ram","");
  local_118._8_8_ = 0;
  pcStack_100 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:64:23)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:64:23)>
              ::_M_manager;
  local_118._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_2b8,(bare_arg_handler_t *)&local_118);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  QPDFArgParser::selectMainOptionTable(&this->ap);
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"sheep","");
  local_138._8_8_ = 0;
  pcStack_120 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:66:25)>
                ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:66:25)>
              ::_M_manager;
  local_138._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_2b8,(bare_arg_handler_t *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"sheep","");
  local_148 = (code *)0x0;
  uStack_140 = 0;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  QPDFArgParser::registerOptionTable(&this->ap,&local_2b8,(bare_arg_handler_t *)&local_158);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,"For more help, read the manual.\n","");
  QPDFArgParser::addHelpFooter(&this->ap,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"quack","");
  paVar2 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Quack Options","");
  paVar3 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,"Just put stuff after quack to get a count at the end.\n","");
  QPDFArgParser::addHelpTopic(&this->ap,&local_2b8,&local_278,&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar3) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"baaa","");
  local_278._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Baaa Options","");
  local_298._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,
             "Ewe can do sheepish things.\nFor example, ewe can add more ram to your computer.\n",""
            );
  QPDFArgParser::addHelpTopic(&this->ap,&local_2b8,&local_278,&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar3) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"--ewe","");
  local_278._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"baaa","");
  local_298._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"just for ewe","");
  paVar4 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"You are not a ewe.\n","");
  QPDFArgParser::addOptionHelp(&this->ap,&local_2b8,&local_278,&local_298,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar4) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar3) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"--ram","");
  local_278._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"baaa","");
  local_298._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"curly horns","");
  local_238._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  QPDFArgParser::addOptionHelp(&this->ap,&local_2b8,&local_278,&local_298,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar4) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar3) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ArgParser::initOptions()
{
    auto b = [this](void (ArgParser::*f)()) { return QPDFArgParser::bindBare(f, this); };
    auto p = [this](void (ArgParser::*f)(std::string const&)) {
        return QPDFArgParser::bindParam(f, this);
    };

    ap.addBare("potato", b(&ArgParser::handlePotato));
    ap.addRequiredParameter("salad", p(&ArgParser::handleSalad), "tossed");
    ap.addOptionalParameter("moo", p(&ArgParser::handleMoo));
    char const* choices[] = {"pig", "boar", "sow", nullptr};
    ap.addChoices("oink", p(&ArgParser::handleOink), true, choices);
    ap.selectHelpOptionTable();
    ap.addBare("version", [this]() { output("3.14159"); });
    ap.selectMainOptionTable();
    ap.addBare("quack", b(&ArgParser::startQuack));
    ap.registerOptionTable("quack", b(&ArgParser::endQuack));
    ap.addPositional(p(&ArgParser::getQuack));
    ap.addFinalCheck(b(&ArgParser::finalChecks));
    ap.selectMainOptionTable();
    ap.addBare("baaa", [this]() { this->ap.selectOptionTable("baaa"); });
    ap.registerOptionTable("baaa", nullptr);
    ap.addBare("ewe", [this]() { output("you"); });
    ap.addBare("ram", [this]() { output("ram"); });
    ap.selectMainOptionTable();
    ap.addBare("sheep", [this]() { this->ap.selectOptionTable("sheep"); });
    ap.registerOptionTable("sheep", nullptr);

    ap.addHelpFooter("For more help, read the manual.\n");
    ap.addHelpTopic(
        "quack", "Quack Options", "Just put stuff after quack to get a count at the end.\n");
    ap.addHelpTopic(
        "baaa",
        "Baaa Options",
        "Ewe can do sheepish things.\n"
        "For example, ewe can add more ram to your computer.\n");
    ap.addOptionHelp("--ewe", "baaa", "just for ewe", "You are not a ewe.\n");
    ap.addOptionHelp("--ram", "baaa", "curly horns", "");
}